

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::CompareModeCase::iterate(CompareModeCase *this)

{
  ostringstream *this_00;
  RenderContext *context;
  TestLog *log;
  bool bVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar4;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *description;
  Texture depthStencilTex;
  Renderbuffer colorBuf;
  Framebuffer fbo;
  TextureLevel stencilOnlyLevel;
  TextureLevel readLevel;
  TextureLevel uploadLevel;
  ObjectWrapper OStack_288;
  ObjectWrapper local_270;
  ObjectWrapper local_258;
  TextureLevel local_240;
  TextureLevel local_218;
  TextureLevel local_1f0;
  ConstPixelBufferAccess local_1c8;
  undefined1 local_1a0 [384];
  long lVar3;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  lVar3 = CONCAT44(extraout_var,iVar2);
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  pOVar4 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_258,(Functions *)CONCAT44(extraout_var_00,iVar2),pOVar4);
  iVar2 = (*context->_vptr_RenderContext[3])(context);
  pOVar4 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper(&local_270,(Functions *)CONCAT44(extraout_var_01,iVar2),pOVar4);
  iVar2 = (*context->_vptr_RenderContext[3])();
  pOVar4 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper(&OStack_288,(Functions *)CONCAT44(extraout_var_02,iVar2),pOVar4)
  ;
  local_1a0._0_8_ = glu::mapGLInternalFormat(this->m_format);
  tcu::TextureLevel::TextureLevel(&local_1f0,(TextureFormat *)local_1a0,0x40,0x40,1);
  local_1a0._0_4_ = RGBA;
  local_1a0._4_4_ = UNSIGNED_INT32;
  tcu::TextureLevel::TextureLevel(&local_218,(TextureFormat *)local_1a0,0x40,0x40,1);
  local_1a0._0_4_ = S;
  local_1a0._4_4_ = UNSIGNED_INT8;
  tcu::TextureLevel::TextureLevel(&local_240,(TextureFormat *)local_1a0,0x40,0x40,1);
  checkDepthStencilFormatSupport((this->super_TestCase).m_context,this->m_format);
  local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,
             "NOTE: Texture compare mode has no effect when reading stencil values.",0x45);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x78));
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_1a0,&local_1f0);
  renderTestPatternReference((PixelBufferAccess *)local_1a0);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_1a0,&local_240);
  renderTestPatternReference((PixelBufferAccess *)local_1a0);
  (**(code **)(lVar3 + 0xb8))(0xde1,OStack_288.m_object);
  (**(code **)(lVar3 + 0x1380))(0xde1,1,this->m_format);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x884c,0x884e);
  (**(code **)(lVar3 + 0x1360))(0xde1,0x884d,0x201);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_1a0,&local_1f0);
  glu::texSubImage2D(context,0xde1,0,0,0,(ConstPixelBufferAccess *)local_1a0);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"Uploading texture data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x38d);
  (**(code **)(lVar3 + 0xa0))(0x8d41,local_270.m_object);
  (**(code **)(lVar3 + 0x1238))(0x8d41,0x8236,0x40,0x40);
  (**(code **)(lVar3 + 0x78))(0x8d40,local_258.m_object);
  (**(code **)(lVar3 + 0x688))(0x8d40,0x8ce0,0x8d41,local_270.m_object);
  checkFramebufferStatus(*(Functions **)(lVar3 + 0x170));
  blitStencilToColor2D(context,OStack_288.m_object,0x40,0x40);
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_1a0,&local_218);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1a0);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_1a0,&local_240);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess(&local_1c8,&local_218);
  bVar1 = compareStencilToRed(log,(ConstPixelBufferAccess *)local_1a0,&local_1c8);
  description = "Image comparison failed";
  if (bVar1) {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar1,description
            );
  tcu::TextureLevel::~TextureLevel(&local_240);
  tcu::TextureLevel::~TextureLevel(&local_218);
  tcu::TextureLevel::~TextureLevel(&local_1f0);
  glu::ObjectWrapper::~ObjectWrapper(&OStack_288);
  glu::ObjectWrapper::~ObjectWrapper(&local_270);
  glu::ObjectWrapper::~ObjectWrapper(&local_258);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx			= m_context.getRenderContext();
		const glw::Functions&		gl					= renderCtx.getFunctions();
		const int					width				= 64;
		const int					height				= 64;
		glu::Framebuffer			fbo					(renderCtx);
		glu::Renderbuffer			colorBuf			(renderCtx);
		glu::Texture				depthStencilTex		(renderCtx);
		TextureLevel				uploadLevel			(glu::mapGLInternalFormat(m_format), width, height);
		TextureLevel				readLevel			(TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT32), width, height);
		TextureLevel				stencilOnlyLevel	(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8), width, height);

		checkDepthStencilFormatSupport(m_context, m_format);

		m_testCtx.getLog() << TestLog::Message << "NOTE: Texture compare mode has no effect when reading stencil values." << TestLog::EndMessage;

		renderTestPatternReference(uploadLevel);
		renderTestPatternReference(stencilOnlyLevel);

		gl.bindTexture(GL_TEXTURE_2D, *depthStencilTex);
		gl.texStorage2D(GL_TEXTURE_2D, 1, m_format, width, height);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_MODE, GL_COMPARE_REF_TO_TEXTURE);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_COMPARE_FUNC, GL_LESS);
		glu::texSubImage2D(renderCtx, GL_TEXTURE_2D, 0, 0, 0, uploadLevel);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading texture data failed");

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, width, height);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		checkFramebufferStatus(gl);

		blitStencilToColor2D(renderCtx, *depthStencilTex, width, height);
		glu::readPixels(renderCtx, 0, 0, readLevel);

		{
			const bool compareOk = compareStencilToRed(m_testCtx.getLog(), stencilOnlyLevel, readLevel);
			m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
									compareOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}